

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

Value * __thiscall Json::Value::operator[](Value *this,int index)

{
  Value *pVVar1;
  undefined8 extraout_RAX;
  ostringstream oss;
  string local_1a0;
  ostringstream local_180 [376];
  
  if (-1 < index) {
    pVVar1 = operator[](this,index);
    return pVVar1;
  }
  std::__cxx11::ostringstream::ostringstream(local_180);
  std::operator<<((ostream *)local_180,
                  "in Json::Value::operator[](int index) const: index cannot be negative");
  std::__cxx11::stringbuf::str();
  throwLogicError(&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

const Value& Value::operator[](int index) const {
  JSON_ASSERT_MESSAGE(
      index >= 0,
      "in Json::Value::operator[](int index) const: index cannot be negative");
  return (*this)[ArrayIndex(index)];
}